

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

ErrorType __thiscall
Network::Client::MQTTv5::disconnect(MQTTv5 *this,ReasonCodes code,Properties *properties)

{
  bool bVar1;
  Type TVar2;
  undefined1 local_c8 [8];
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)14,_false> packet;
  Properties *properties_local;
  ReasonCodes code_local;
  MQTTv5 *this_local;
  ErrorType ret;
  
  packet.payload.super_EmptySerializable.super_Serializable._vptr_Serializable =
       (EmptySerializable)(EmptySerializable)properties;
  if (((code == GrantedQoS0) || (code == DisconnectWithWillMessage)) || (0x7f < (int)code)) {
    bVar1 = ImplBase<Network::Client::MQTTv5::Impl>::isOpen
                      (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
    if (bVar1) {
      Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)14,_false>::
      ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)14,_false> *)local_c8)
      ;
      properties_local._4_1_ = (uchar)code;
      Protocol::MQTT::V5::GenericType<unsigned_char>::operator=
                ((GenericType<unsigned_char> *)
                 &packet.fixedVariableHeader.super_FixedFieldWithReason.
                  super_FixedFieldWithRemainingLength.remLength,properties_local._4_1_);
      Protocol::MQTT::V5::Properties::capture
                ((Properties *)
                 &packet.fixedVariableHeader.super_FixedFieldWithReason.reasonCode.value,
                 (Properties *)
                 packet.payload.super_EmptySerializable.super_Serializable._vptr_Serializable);
      ImplBase<Network::Client::MQTTv5::Impl>::setConnectionState
                (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,Disconnecting);
      this_local._4_4_ =
           ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
                     (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,
                      (ControlPacketSerializable *)local_c8,false,false);
      TVar2 = ErrorType::operator_cast_to_Type((ErrorType *)((long)&this_local + 4));
      if (TVar2 == Success) {
        ImplBase<Network::Client::MQTTv5::Impl>::close
                  (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
        ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),Success);
      }
      Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)14,_false>::
      ~ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)14,_false> *)local_c8
                    );
    }
    else {
      ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),Success);
    }
  }
  else {
    ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),BadParameter);
  }
  return (ErrorType)this_local._4_4_;
}

Assistant:

MQTTv5::ErrorType MQTTv5::disconnect(const ReasonCodes code, Properties * properties)
    {
        if (code != ReasonCodes::NormalDisconnection && code != ReasonCodes::DisconnectWithWillMessage && code < ReasonCodes::UnspecifiedError)
            return ErrorType::BadParameter;


        if (!impl->isOpen()) return ErrorType::Success;

        Protocol::MQTT::V5::ControlPacket<Protocol::MQTT::V5::DISCONNECT> packet;
        packet.fixedVariableHeader.reasonCode = code;
        // Capture properties (to avoid copying them)
        packet.props.capture(properties);

#if MQTTAvoidValidation != 1
        if (!packet.props.checkPropertiesFor(Protocol::MQTT::V5::DISCONNECT))
            return ErrorType::BadProperties;
#endif

        impl->setConnectionState(State::Disconnecting);
        if (ErrorType ret = impl->prepareSAR(packet, false))
            return ret;

        // There is no need to wait for ACK for a disconnect
        impl->close();
        return ErrorType::Success;
    }